

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_stock.cpp
# Opt level: O0

void use_stock_with_constructor(void)

{
  Stock *pSVar1;
  undefined1 local_260 [8];
  Stock higher;
  string local_220;
  undefined1 local_200 [8];
  Stock qs;
  string local_1c0;
  Stock local_1a0;
  allocator local_161;
  string local_160;
  undefined1 local_140 [8];
  Stock w_w;
  string local_100;
  Stock *local_e0;
  Stock *p_stock;
  string local_d0;
  undefined1 local_b0 [8];
  Stock aaj;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  Stock merlin;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"Apple",&local_61);
  L10_2::Stock::Stock((Stock *)local_40,&local_60,0x14,30.0);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  L10_2::Stock::show((Stock *)local_40);
  L10_2::Stock::buy((Stock *)local_40,0x1e,50.0);
  L10_2::Stock::show((Stock *)local_40);
  L10_2::Stock::sell((Stock *)local_40,1000,12.45);
  L10_2::Stock::show((Stock *)local_40);
  L10_2::Stock::buy((Stock *)local_40,30000,58.3);
  L10_2::Stock::show((Stock *)local_40);
  L10_2::Stock::sell((Stock *)local_40,30000,0.125);
  L10_2::Stock::show((Stock *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"Microsoft",(allocator *)((long)&p_stock + 7));
  L10_2::Stock::Stock((Stock *)local_b0,&local_d0,0x14,30.0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&p_stock + 7));
  L10_2::Stock::show((Stock *)local_b0);
  pSVar1 = (Stock *)operator_new(0x38);
  w_w.total_val._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_100,"Google",(allocator *)((long)&w_w.total_val + 7));
  L10_2::Stock::Stock(pSVar1,&local_100,0x1e,50.0);
  w_w.total_val._6_1_ = 0;
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)((long)&w_w.total_val + 7));
  local_e0 = pSVar1;
  L10_2::Stock::show(pSVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_160,"Oracle",&local_161);
  L10_2::Stock::Stock((Stock *)local_140,&local_160,300,20.0);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  L10_2::Stock::show((Stock *)local_140);
  std::operator<<((ostream *)&std::cout,"----> re assign to exist stock:\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1c0,"Facebook",(allocator *)((long)&qs.total_val + 7));
  L10_2::Stock::Stock(&local_1a0,&local_1c0,0,0.0);
  L10_2::Stock::operator=((Stock *)local_140,&local_1a0);
  L10_2::Stock::~Stock(&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&qs.total_val + 7));
  L10_2::Stock::show((Stock *)local_140);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_220,"Ali",(allocator *)((long)&higher.total_val + 7));
  L10_2::Stock::Stock((Stock *)local_200,&local_220,0,0.0);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)((long)&higher.total_val + 7));
  L10_2::Stock::show((Stock *)local_200);
  pSVar1 = L10_2::Stock::compare((Stock *)local_40,(Stock *)local_b0);
  L10_2::Stock::Stock((Stock *)local_260,pSVar1);
  L10_2::Stock::show((Stock *)local_260);
  L10_2::Stock::~Stock((Stock *)local_260);
  L10_2::Stock::~Stock((Stock *)local_200);
  L10_2::Stock::~Stock((Stock *)local_140);
  L10_2::Stock::~Stock((Stock *)local_b0);
  L10_2::Stock::~Stock((Stock *)local_40);
  return;
}

Assistant:

void use_stock_with_constructor() {
    using namespace L10_2;

    //  call constructor explicitly
    Stock merlin = Stock("Apple", 20, 30);
//    merlin.acquire("Apple", 20, 30);
    merlin.show();
    merlin.buy(30, 50);
    merlin.show();
    merlin.sell(1000, 12.45);
    merlin.show();
    merlin.buy(30000, 58.3);
    merlin.show();
    merlin.sell(30000, 0.125);
    merlin.show();

    //  call constructor implicitly
    Stock aaj("Microsoft", 20, 30);
    aaj.show();

    //  create with *new*， without a name, but holding it with a pointer
    Stock * p_stock = new Stock("Google", 30, 50);
    p_stock->show();

    Stock w_w("Oracle", 300, 20);
    w_w.show();

    std::cout << "----> re assign to exist stock:\n";
    //  创建临时实例，并复制到目标对象中，再将临时实例丢弃
    w_w = Stock("Facebook");
    w_w.show();
//    merlin = Stock("Oracle", 300, 20);

    const Stock qs("Ali");
    qs.show();

    //  比较并获取引用，不生成新的
    const Stock higher = merlin.compare(aaj);
    higher.show();
}